

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int fits_translate_keyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int n_value,int n_offset,
              int n_range,int *pat_num,int *i,int *j,int *m,int *n,int *status)

{
  byte bVar1;
  char *__s1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ushort **ppuVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  byte *pbVar15;
  char *pcVar16;
  byte bVar17;
  long lVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  uint local_94;
  int local_90;
  uint local_8c;
  int local_78;
  
  iVar10 = *status;
  if (*status < 1) {
    if (inrec == (char *)0x0 || outrec == (char *)0x0) {
      *status = 0x73;
      iVar10 = 0x73;
    }
    else {
      *outrec = '\0';
      if (*inrec == '\0') {
        builtin_strncpy(inrec,"        ",9);
      }
      if (npat < 1) {
        bVar21 = true;
        bVar17 = 0x20;
        local_8c = 0;
        local_78 = 0;
        local_90 = 0;
        local_94 = 0;
        uVar8 = 0;
      }
      else {
        uVar12 = 0;
        bVar2 = false;
        bVar4 = 0;
        do {
          pbVar15 = (byte *)patterns[uVar12][0];
          bVar1 = *pbVar15;
          local_8c = (uint)uVar12;
          if (bVar1 == 0x2a) {
            bVar21 = true;
            bVar17 = 0x20;
            local_94 = 0xffffffff;
            local_78 = 0;
            local_90 = 0;
            uVar8 = 0xffffffff;
            break;
          }
          if ((bVar2) && (bVar1 == bVar4)) {
            local_78 = 0;
            bVar2 = true;
            bVar17 = 0x20;
            local_94 = 0xffffffff;
            local_90 = 0;
            uVar8 = 0xffffffff;
            bVar21 = false;
          }
          else {
            bVar4 = *pbVar15;
            if (bVar4 == 0) {
              bVar21 = true;
              bVar17 = 0x20;
              local_94 = 0xffffffff;
              bVar2 = true;
              local_78 = 0;
              local_90 = 0;
              uVar8 = 0xffffffff;
              iVar10 = 0;
            }
            else {
              uVar8 = 0xffffffff;
              bVar17 = 0x20;
              lVar13 = 0;
              bVar2 = true;
              bVar20 = false;
              iVar10 = 0;
              local_94 = 0xffffffff;
              local_90 = 0;
              local_78 = 0;
              do {
                lVar18 = (long)iVar10;
                bVar19 = inrec[lVar18];
                lVar11 = (long)(char)bVar19;
                iVar7 = iVar10;
                uVar14 = local_94;
                if (bVar4 < 0x69) {
                  if (bVar4 == 0x23) {
LAB_0017d826:
                    ppuVar9 = __ctype_b_loc();
                    bVar20 = false;
                    if ((*(byte *)((long)*ppuVar9 + lVar11 * 2 + 1) & 8) != 0) {
                      uVar6 = 0;
                      if (iVar10 < 8) {
                        uVar6 = 0;
                        do {
                          if ((*(byte *)((long)*ppuVar9 + (long)(char)bVar19 * 2 + 1) & 8) == 0)
                          goto LAB_0017d8f0;
                          uVar6 = ((int)(char)bVar19 + uVar6 * 10) - 0x30;
                          bVar19 = inrec[lVar18 + 1];
                          lVar18 = lVar18 + 1;
                          iVar10 = iVar10 + 1;
                        } while (lVar18 != 8);
                        iVar10 = 8;
                      }
LAB_0017d8f0:
                      iVar10 = iVar10 + -1;
                      uVar3 = uVar6;
                      if ((bVar4 == 0x6d) || (uVar3 = uVar8, bVar4 != 0x6e)) goto LAB_0017d94e;
                      iVar7 = iVar10;
                      if (uVar6 - 1 < 999) {
                        if ((uVar6 == n_value && n_range == 0) ||
                           (n_range == -1 && (int)uVar6 <= n_value)) {
                          bVar20 = true;
                          local_94 = uVar6;
                          goto LAB_0017d953;
                        }
                        uVar14 = uVar6;
                        if (n_range == 1 && n_value <= (int)uVar6) goto LAB_0017d94e;
                      }
                      bVar20 = false;
                    }
                  }
                  else {
                    uVar3 = uVar8;
                    if (bVar4 != 0x3f) {
                      if (bVar4 == 0x61) {
                        ppuVar9 = __ctype_b_loc();
                        if (bVar19 == 0x20 || (*(byte *)((long)*ppuVar9 + lVar11 * 2 + 1) & 1) != 0)
                        {
                          bVar20 = true;
                          bVar17 = bVar19;
                        }
                      }
                      else {
LAB_0017d8a6:
                        bVar20 = bVar19 == bVar4;
                      }
                      goto LAB_0017d953;
                    }
LAB_0017d94e:
                    local_94 = uVar14;
                    uVar8 = uVar3;
                    bVar20 = true;
                    iVar7 = iVar10;
                  }
                }
                else {
                  if (bVar4 - 0x6d < 2) goto LAB_0017d826;
                  if (bVar4 == 0x6a) {
                    ppuVar9 = __ctype_b_loc();
                    if ((*(byte *)((long)*ppuVar9 + lVar11 * 2 + 1) & 8) != 0) {
                      local_90 = (char)bVar19 + -0x30;
LAB_0017d8d7:
                      bVar20 = true;
                    }
                  }
                  else {
                    if (bVar4 != 0x69) goto LAB_0017d8a6;
                    ppuVar9 = __ctype_b_loc();
                    if ((*(byte *)((long)*ppuVar9 + lVar11 * 2 + 1) & 8) != 0) {
                      local_78 = (char)bVar19 + -0x30;
                      goto LAB_0017d8d7;
                    }
                  }
                }
LAB_0017d953:
                bVar21 = !bVar20;
                iVar10 = iVar7;
                if (bVar21) break;
                iVar10 = iVar7 + 1;
                bVar4 = pbVar15[lVar13 + 1];
                bVar2 = false;
                if (bVar4 == 0) break;
                lVar13 = lVar13 + 1;
                bVar20 = true;
              } while (iVar7 < 7);
            }
            bVar4 = bVar1;
            if (bVar21) {
              bVar21 = false;
            }
            else if ((7 < iVar10) || (bVar21 = true, inrec[iVar10] == ' ')) {
              bVar21 = true;
              break;
            }
          }
          uVar12 = uVar12 + 1;
          local_8c = npat;
        } while (uVar12 != (uint)npat);
        bVar21 = !bVar21;
      }
      if (i != (int *)0x0) {
        *i = local_78;
      }
      if (j != (int *)0x0) {
        *j = local_90;
      }
      if (n != (int *)0x0) {
        *n = local_94;
      }
      if (m != (int *)0x0) {
        *m = uVar8;
      }
      if (pat_num != (int *)0x0) {
        *pat_num = local_8c;
      }
      iVar7 = 0;
      iVar10 = 0;
      if (!bVar21) {
        __s1 = patterns[local_8c][1];
        iVar5 = strcmp(__s1,"--");
        if (iVar5 == 0) {
          outrec[0] = '-';
          outrec[1] = '\0';
          strncat(outrec,inrec,8);
          outrec[9] = '\0';
          uVar12 = 9;
          do {
            uVar8 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar8;
            if (outrec[uVar12] != ' ') {
              return 0;
            }
            outrec[uVar12] = '\0';
            iVar10 = iVar7;
          } while (2 < uVar8);
        }
        else if (((*__s1 != '\0') && (iVar5 = strcmp(__s1,"-"), iVar10 = iVar7, iVar5 != 0)) &&
                (strcpy(outrec,inrec), *__s1 != '+')) {
          lVar13 = 0;
          iVar10 = 0;
          do {
            bVar4 = __s1[lVar13];
            if (bVar4 < 0x6a) {
              if (bVar4 == 0x69) {
                outrec[iVar10] = (char)local_78 + '0';
              }
              else {
                if (bVar4 == 0) {
                  if (iVar10 < 8) {
                    memset(outrec + iVar10,0x20,(ulong)(7 - iVar10) + 1);
                  }
                  return *status;
                }
LAB_0017dc05:
                if ((bVar4 == 0x6d) && (-1 < (int)uVar8)) {
                  uVar14 = 1;
                  uVar6 = uVar8;
                  while (0 < (int)uVar6) {
                    uVar14 = uVar14 * 10;
                    uVar6 = uVar8 / uVar14;
                  }
                  if (9 < uVar14) {
                    pbVar15 = (byte *)(outrec + iVar10);
                    do {
                      uVar12 = (ulong)uVar8 / ((ulong)uVar14 / 10);
                      *pbVar15 = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
                      pbVar15 = pbVar15 + 1;
                      iVar10 = iVar10 + 1;
                      bVar21 = 99 < uVar14;
                      uVar14 = uVar14 / 10;
                    } while (bVar21);
                  }
                  iVar10 = iVar10 + -1;
                }
                else if (bVar4 == 0x61) {
                  outrec[iVar10] = bVar17;
                }
                else {
                  outrec[iVar10] = bVar4;
                }
              }
            }
            else if (bVar4 == 0x6a) {
              outrec[iVar10] = (char)local_90 + '0';
            }
            else {
              if (bVar4 != 0x6e) goto LAB_0017dc05;
              if (local_94 == 0xffffffff) {
                local_94 = n_value;
              }
              if (0 < (int)local_94) {
                bVar21 = SCARRY4(local_94,n_offset);
                local_94 = local_94 + n_offset;
                if (local_94 == 0 || bVar21 != (int)local_94 < 0) {
                  uVar14 = 1;
                }
                else {
                  uVar14 = 1;
                  do {
                    uVar14 = uVar14 * 10;
                  } while (0 < (int)(local_94 / uVar14));
                }
                if (9 < uVar14) {
                  pcVar16 = outrec + iVar10;
                  do {
                    iVar7 = (int)local_94 / (int)(uVar14 / 10);
                    *pcVar16 = (char)iVar7 + (char)(iVar7 / 10) * -10 + '0';
                    pcVar16 = pcVar16 + 1;
                    iVar10 = iVar10 + 1;
                    bVar21 = 99 < uVar14;
                    uVar14 = uVar14 / 10;
                  } while (bVar21);
                }
                iVar10 = iVar10 + -1;
              }
            }
            lVar13 = lVar13 + 1;
            iVar10 = iVar10 + 1;
          } while( true );
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int fits_translate_keyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int n_value,        /* I - base 'n' template value of interest */
      int n_offset,       /* I - offset to be applied to the 'n' */
                          /*     value in the output string */
      int n_range,        /* I - controls range of 'n' template */
                          /*     values of interest (-1,0, or +1) */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,             /* O - value of i, if any, else 0 */
      int *j,             /* O - value of j, if any, else 0 */
      int *m,             /* O - value of m, if any, else 0 */
      int *n,             /* O - value of n, if any, else 0 */

      int *status)        /* IO - error status */

/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n - column number of one or more digits, preserved in output template
     m - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

  This routine was written by Craig Markwardt, GSFC
*/

{
    int i1 = 0, j1 = 0, n1 = 0, m1 = 0;
    int fac;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);
    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
/*
    if (*inrec == '\0') return 0;
*/

    if (*inrec == '\0')    /* expand to full 8 char blank keyword name */
       strcpy(inrec, "        ");
       
    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {
      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0; m1 = -1; n1 = -1; a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == '#')) {
	  /* Special patterns: multi-digit number */
	  int val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];
	    
	    if (s == 'n') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999 &&                    /* Row range check */
		   (((n_range == 0) && (val == n_value)) ||     /* Strict equality */
		    ((n_range == -1) && (val <= n_value)) ||    /* n <= n_value */
		    ((n_range == +1) && (val >= n_value))) ) {  /* n >= n_value */
		n1 = val;
	      } else {
		pass = 0;
	      }
	    } else if (s == 'm') {
	      
	      /* Generic number */
	      m1 = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	if (!pass) break;
      }
      
      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }

    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = n1; }
    if (m) { *m = m1; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: explicit deletion, return '-' */
    if (pass && strcmp(spat,"--") == 0) {
      strcpy(outrec, "-");
      strncat(outrec, inrec, 8);
      outrec[9] = 0;
      for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;
      return 0;
    }

    /* Return case: no match, or do-not-transfer pattern */
    if (pass == 0 || spat[0] == '\0' || strcmp(spat,"-") == 0) return 0;
    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;


    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n') {
	if (n1 == -1) { n1 = n_value; }
	if (n1 > 0) {
	  n1 += n_offset;
	  for (fac = 1; (n1/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((n1/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
	}
      } else if (s == 'm' && m1 >= 0) {
	for (fac = 1; (m1/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((m1/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}